

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

string * __thiscall
glcts::ViewportArray::DrawMulitpleViewportsWithSingleInvocation::getFragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,DrawMulitpleViewportsWithSingleInvocation *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\nflat in  int gs_fs_color;\n     out int fs_out_color;\n\nvoid main()\n{\n    fs_out_color = gs_fs_color;\n}\n\n"
             ,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string DrawMulitpleViewportsWithSingleInvocation::getFragmentShader()
{
	static const GLchar* source = "${VERSION}\n"
								  "\n"
								  "flat in  int gs_fs_color;\n"
								  "     out int fs_out_color;\n"
								  "\n"
								  "void main()\n"
								  "{\n"
								  "    fs_out_color = gs_fs_color;\n"
								  "}\n"
								  "\n";

	std::string result = source;

	return result;
}